

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManEquivCountLitsAll(Gia_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)p->nObjs;
  if (p->nObjs < 1) {
    uVar2 = uVar3;
  }
  iVar1 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = (iVar1 + 1) - (uint)((~(uint)p->pReprs[uVar3] & 0xfffffff) == 0);
  }
  return iVar1;
}

Assistant:

int Gia_ManEquivCountLitsAll( Gia_Man_t * p )
{
    int i, nLits = 0;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        nLits += (Gia_ObjRepr(p, i) != GIA_VOID);
    return nLits;
}